

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

PersistentRowGroupData *
duckdb::PersistentRowGroupData::Deserialize
          (PersistentRowGroupData *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  undefined4 extraout_var;
  reference __args;
  idx_t i;
  size_type __n;
  type local_70;
  
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,100,"types",&__return_storage_ptr__->types);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"columns");
  iVar1 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  for (__n = 0; CONCAT44(extraout_var,iVar1) != __n; __n = __n + 1) {
    __args = vector<duckdb::LogicalType,_true>::get<true>(&__return_storage_ptr__->types,__n);
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::emplace_back<duckdb::LogicalType_const&>
              ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                *)&(deserializer->data).types,__args);
    Deserializer::Read<duckdb::PersistentColumnData>(&local_70,deserializer);
    ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
    emplace_back<duckdb::PersistentColumnData>
              (&(__return_storage_ptr__->column_data).
                super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               ,&local_70);
    PersistentColumnData::~PersistentColumnData(&local_70);
    SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadProperty<unsigned_long>
            (deserializer,0x66,"start",&__return_storage_ptr__->start);
  Deserializer::ReadProperty<unsigned_long>
            (deserializer,0x67,"count",&__return_storage_ptr__->count);
  return __return_storage_ptr__;
}

Assistant:

PersistentRowGroupData PersistentRowGroupData::Deserialize(Deserializer &deserializer) {
	PersistentRowGroupData data;
	deserializer.ReadProperty(100, "types", data.types);
	deserializer.ReadList(101, "columns", [&](Deserializer::List &list, idx_t i) {
		deserializer.Set<const LogicalType &>(data.types[i]);
		data.column_data.push_back(list.ReadElement<PersistentColumnData>());
		deserializer.Unset<LogicalType>();
	});
	deserializer.ReadProperty(102, "start", data.start);
	deserializer.ReadProperty(103, "count", data.count);
	return data;
}